

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

MPP_RET mpi_enc_test_cmd_update_by_args(MpiEncTestArgs *cmd,int argc,char **argv)

{
  MPP_RET MVar1;
  int iVar2;
  FpsCalc ctx;
  uint uVar3;
  long lVar4;
  MppOpt opts;
  
  opts = (MppOpt)0x0;
  if ((argv == (char **)0x0 || cmd == (MpiEncTestArgs *)0x0) || argc < 2) {
    MVar1 = MPP_NOK;
  }
  else {
    cmd->rc_mode = 5;
    mpp_opt_init(&opts);
    mpp_opt_setup(opts,cmd);
    for (lVar4 = 0; lVar4 != 0x4e0; lVar4 = lVar4 + 0x20) {
      mpp_opt_add(opts,(MppOptInfo *)((long)&enc_opts[0].name + lVar4));
    }
    mpp_opt_add(opts,(MppOptInfo *)0x0);
    MVar1 = mpp_opt_parse(opts,argc,argv);
    if (cmd->type < MPP_VIDEO_CodingMPEG2) {
      _mpp_log_l(2,"mpi_enc_utils","invalid type %d\n",0);
      MVar1 = MPP_NOK;
    }
    if (cmd->rc_mode == 5) {
      cmd->rc_mode = (uint)(cmd->type == MPP_VIDEO_CodingMJPEG) * 2;
    }
    iVar2 = cmd->hor_stride;
    if (iVar2 == 0) {
      iVar2 = mpi_enc_width_default_stride(cmd->width,cmd->format);
      cmd->hor_stride = iVar2;
    }
    uVar3 = cmd->ver_stride;
    if (uVar3 == 0) {
      uVar3 = cmd->height + 1U & 0xfffffffe;
      cmd->ver_stride = uVar3;
    }
    if (cmd->type_src == MPP_VIDEO_CodingUnused) {
      if ((((cmd->width < 1) || (cmd->height < 1)) || (iVar2 < 1)) || ((int)uVar3 < 1)) {
        _mpp_log_l(2,"mpi_enc_utils","invalid w:h [%d:%d] stride [%d:%d]\n",0,cmd->width,cmd->height
                   ,iVar2,uVar3);
        MVar1 = MPP_NOK;
      }
    }
    if (((cmd->rc_mode == 2) && (cmd->qp_init == 0)) &&
       ((cmd->type == MPP_VIDEO_CodingHEVC || (cmd->type == MPP_VIDEO_CodingAVC)))) {
      cmd->qp_init = 0x1a;
    }
    if (cmd->trace_fps != 0) {
      fps_calc_init(&cmd->fps);
      ctx = cmd->fps;
      if (ctx == (FpsCalc)0x0) {
        _mpp_log_l(2,"mpi_enc_utils","Assertion %s failed at %s:%d\n",0,"cmd->fps",
                   "mpi_enc_test_cmd_update_by_args",0x370);
        if ((DAT_00118343 & 0x10) != 0) {
          abort();
        }
        ctx = cmd->fps;
      }
      fps_calc_set_cb(ctx,show_enc_fps);
    }
  }
  if (opts != (MppOpt)0x0) {
    mpp_opt_deinit(opts);
    opts = (MppOpt)0x0;
  }
  if (MVar1 != MPP_OK) {
    mpi_enc_show_help(*argv);
  }
  return MVar1;
}

Assistant:

MPP_RET mpi_enc_test_cmd_update_by_args(MpiEncTestArgs* cmd, int argc, char **argv)
{
    MppOpt opts = NULL;
    RK_S32 ret = -1;
    RK_U32 i;

    if ((argc < 2) || NULL == cmd || NULL == argv)
        goto done;

    cmd->rc_mode = MPP_ENC_RC_MODE_BUTT;

    mpp_opt_init(&opts);
    /* should change node count when option increases */
    mpp_opt_setup(opts, cmd);

    for (i = 0; i < enc_opt_cnt; i++)
        mpp_opt_add(opts, &enc_opts[i]);

    /* mark option end */
    mpp_opt_add(opts, NULL);
    ret = mpp_opt_parse(opts, argc, argv);
    /* check essential parameter */
    if (cmd->type <= MPP_VIDEO_CodingAutoDetect) {
        mpp_err("invalid type %d\n", cmd->type);
        ret = MPP_NOK;
    }

    if (cmd->rc_mode == MPP_ENC_RC_MODE_BUTT)
        cmd->rc_mode = (cmd->type == MPP_VIDEO_CodingMJPEG) ?
                       MPP_ENC_RC_MODE_FIXQP : MPP_ENC_RC_MODE_VBR;

    if (!cmd->hor_stride)
        cmd->hor_stride = mpi_enc_width_default_stride(cmd->width, cmd->format);
    if (!cmd->ver_stride)
        cmd->ver_stride = MPP_ALIGN(cmd->height, 2);

    if (cmd->type_src == MPP_VIDEO_CodingUnused) {
        if (cmd->width <= 0 || cmd->height <= 0 ||
            cmd->hor_stride <= 0 || cmd->ver_stride <= 0) {
            mpp_err("invalid w:h [%d:%d] stride [%d:%d]\n",
                    cmd->width, cmd->height, cmd->hor_stride, cmd->ver_stride);
            ret = MPP_NOK;
        }
    }

    if (cmd->rc_mode == MPP_ENC_RC_MODE_FIXQP) {
        if (!cmd->qp_init) {
            if (cmd->type == MPP_VIDEO_CodingAVC ||
                cmd->type == MPP_VIDEO_CodingHEVC)
                cmd->qp_init = 26;
        }
    }

    if (cmd->trace_fps) {
        fps_calc_init(&cmd->fps);
        mpp_assert(cmd->fps);
        fps_calc_set_cb(cmd->fps, show_enc_fps);
    }

done:
    if (opts) {
        mpp_opt_deinit(opts);
        opts = NULL;
    }
    if (ret)
        mpi_enc_show_help(argv[0]);

    return ret;
}